

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

pair<void_*,_void_*> __thiscall
poly::
vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>_>
::destroy_range(vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>_>
                *this,elem_ptr_pointer first,elem_ptr_pointer last)

{
  void *pvVar1;
  void *pvVar2;
  pair<void_*,_void_*> pVar3;
  
  if (first == last) {
    pvVar2 = (void *)0x0;
    pvVar1 = (void *)0x0;
  }
  else {
    pvVar2 = (first->ptr).first;
    if (this->_free_elem != last) {
      this = (vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>_>
              *)last;
    }
    pvVar1 = ((pair<void_*,_Interface_*> *)
             &(this->
              super_allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>
              )._end_storage)->first;
  }
  for (; first != last; first = first + 1) {
    (*((first->ptr).second)->_vptr_Interface[3])();
    (first->ptr).second = (Interface *)0x0;
    (first->sf).first = 0;
    (first->
    super_CloningPolicyHolder<poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>,_std::integral_constant<bool,_true>_>
    ).
    super_delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>
    .cf = (clone_func_ptr_t)0x0;
    (first->ptr).first = (void *)0x0;
    (first->sf).second = 0;
  }
  pVar3.second = pvVar1;
  pVar3.first = pvVar2;
  return pVar3;
}

Assistant:

inline auto vector<I, A, C>::destroy_range(elem_ptr_pointer first, elem_ptr_pointer last) noexcept
    -> std::pair<void_pointer, void_pointer>
{
    std::pair<void_pointer, void_pointer> ret {};
    if (first != last) {
        ret.first  = first->ptr.first;
        ret.second = last != end_elem() ? last->ptr.first : base().end_storage();
    }
    for (; first != last; ++first) {
        destroy_elem(first);
    }
    return ret;
}